

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

void addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
               (NeuralNetworkClassifier *nn,OptimizerTypeCase optimizerType,int64_t defaultValue,
               int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  int iVar1;
  long lVar2;
  NetworkUpdateParameters *pNVar3;
  Optimizer *pOVar4;
  SGDOptimizer *this;
  Int64Parameter *pIVar5;
  AdamOptimizer *this_00;
  Int64Set *pIVar6;
  _Base_ptr p_Var7;
  Int64Range *pIVar8;
  _Rb_tree_header *p_Var9;
  Int64Parameter **ppIVar10;
  
  if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
    pNVar3 = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(pNVar3);
    nn->updateparams_ = pNVar3;
  }
  pNVar3 = nn->updateparams_;
  if (pNVar3->optimizer_ == (Optimizer *)0x0) {
    pOVar4 = (Optimizer *)operator_new(0x20);
    CoreML::Specification::Optimizer::Optimizer(pOVar4);
    pNVar3->optimizer_ = pOVar4;
  }
  pOVar4 = pNVar3->optimizer_;
  if (optimizerType == kAdamOptimizer) {
    if (pOVar4->_oneof_case_[0] != 0xb) {
      CoreML::Specification::Optimizer::clear_OptimizerType(pOVar4);
      pOVar4->_oneof_case_[0] = 0xb;
      this_00 = (AdamOptimizer *)operator_new(0x40);
      CoreML::Specification::AdamOptimizer::AdamOptimizer(this_00);
      (pOVar4->OptimizerType_).adamoptimizer_ = this_00;
    }
    ppIVar10 = &((pOVar4->OptimizerType_).sgdoptimizer_)->minibatchsize_;
    if (((pOVar4->OptimizerType_).sgdoptimizer_)->minibatchsize_ == (Int64Parameter *)0x0) {
      pIVar5 = (Int64Parameter *)operator_new(0x28);
      CoreML::Specification::Int64Parameter::Int64Parameter(pIVar5);
LAB_001a6b38:
      *ppIVar10 = pIVar5;
    }
  }
  else {
    if (optimizerType != kSgdOptimizer) {
      pIVar5 = (Int64Parameter *)0x0;
      goto LAB_001a6b45;
    }
    if (pOVar4->_oneof_case_[0] != 10) {
      CoreML::Specification::Optimizer::clear_OptimizerType(pOVar4);
      pOVar4->_oneof_case_[0] = 10;
      this = (SGDOptimizer *)operator_new(0x30);
      CoreML::Specification::SGDOptimizer::SGDOptimizer(this);
      (pOVar4->OptimizerType_).sgdoptimizer_ = this;
    }
    ppIVar10 = &((pOVar4->OptimizerType_).sgdoptimizer_)->minibatchsize_;
    if (((pOVar4->OptimizerType_).sgdoptimizer_)->minibatchsize_ == (Int64Parameter *)0x0) {
      pIVar5 = (Int64Parameter *)operator_new(0x28);
      CoreML::Specification::Int64Parameter::Int64Parameter(pIVar5);
      goto LAB_001a6b38;
    }
  }
  pIVar5 = *ppIVar10;
LAB_001a6b45:
  pIVar5->defaultvalue_ = defaultValue;
  if ((allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (pIVar5->_oneof_case_[0] != 10) {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar5);
      pIVar5->_oneof_case_[0] = 10;
      pIVar8 = (Int64Range *)operator_new(0x28);
      CoreML::Specification::Int64Range::Int64Range(pIVar8);
      (pIVar5->AllowedValues_).range_ = pIVar8;
    }
    pIVar8 = (pIVar5->AllowedValues_).range_;
    pIVar8->minvalue_ = minValue;
    pIVar8->maxvalue_ = maxValue;
  }
  else {
    if (pIVar5->_oneof_case_[0] != 0xb) {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar5);
      pIVar5->_oneof_case_[0] = 0xb;
      pIVar6 = (Int64Set *)operator_new(0x28);
      CoreML::Specification::Int64Set::Int64Set(pIVar6);
      (pIVar5->AllowedValues_).set_ = pIVar6;
    }
    p_Var7 = (allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(allowedValues->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var9) {
      pIVar6 = (pIVar5->AllowedValues_).set_;
      do {
        lVar2 = *(long *)(p_Var7 + 1);
        iVar1 = (pIVar6->values_).total_size_;
        if ((pIVar6->values_).current_size_ == iVar1) {
          google::protobuf::RepeatedField<long>::Reserve(&pIVar6->values_,iVar1 + 1);
        }
        iVar1 = (pIVar6->values_).current_size_;
        (pIVar6->values_).current_size_ = iVar1 + 1;
        ((pIVar6->values_).rep_)->elements[iVar1] = lVar2;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var9);
    }
  }
  return;
}

Assistant:

void addMiniBatchSize(NeuralNetworkClass *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    
    Specification::Int64Parameter *miniBatchSize = NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            miniBatchSize = optimizer->mutable_sgdoptimizer()->mutable_minibatchsize();
            break;
        case Specification::Optimizer::kAdamOptimizer:
            miniBatchSize = optimizer->mutable_adamoptimizer()->mutable_minibatchsize();
            break;
        default:
            break;
    }
    
    miniBatchSize->set_defaultvalue(defaultValue);
    
    if (allowedValues.size() == 0) {
        auto int64Range = miniBatchSize->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = miniBatchSize->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}